

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O1

void ImTui_ImplText_RenderDrawData(ImDrawData *drawData,TScreen *screen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ImDrawList *pIVar10;
  ImDrawCmd *pIVar11;
  unsigned_short *puVar12;
  ImDrawVert *pIVar13;
  uchar col;
  undefined4 in_EAX;
  int iVar14;
  ImGuiIO *pIVar15;
  TCell *pTVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  int iVar33;
  int iVar35;
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float local_118;
  undefined1 local_c8 [48];
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  
  iVar33 = (int)((drawData->FramebufferScale).x * (drawData->DisplaySize).x);
  iVar35 = (int)((drawData->FramebufferScale).y * (drawData->DisplaySize).y);
  auVar30._0_4_ = -(uint)(0 < iVar33);
  auVar30._4_4_ = -(uint)(0 < iVar33);
  auVar30._8_4_ = -(uint)(0 < iVar35);
  auVar30._12_4_ = -(uint)(0 < iVar35);
  iVar14 = movmskpd(in_EAX,auVar30);
  if (iVar14 == 3) {
    pIVar15 = ImGui::GetIO();
    IVar3 = pIVar15->DisplaySize;
    pIVar15 = ImGui::GetIO();
    local_118 = IVar3.x;
    iVar14 = (int)(pIVar15->DisplaySize).y;
    screen->nx = (int)local_118;
    screen->ny = iVar14;
    if (screen->nmax < iVar14 * (int)local_118) {
      if (screen->data != (TCell *)0x0) {
        operator_delete__(screen->data);
      }
      lVar18 = (long)screen->ny * (long)screen->nx;
      iVar14 = (int)lVar18;
      screen->nmax = iVar14;
      uVar23 = 0xffffffffffffffff;
      if (-1 < iVar14) {
        uVar23 = lVar18 * 4;
      }
      pTVar16 = (TCell *)operator_new__(uVar23);
      screen->data = pTVar16;
    }
    if (screen->data != (TCell *)0x0) {
      memset(screen->data,0,(long)screen->ny * (long)screen->nx * 4);
    }
    if (0 < drawData->CmdListsCount) {
      IVar3 = drawData->DisplayPos;
      IVar4 = drawData->FramebufferScale;
      lVar18 = 0;
      do {
        pIVar10 = drawData->CmdLists[lVar18];
        if (0 < (pIVar10->CmdBuffer).Size) {
          lVar19 = 0;
          do {
            pIVar11 = (pIVar10->CmdBuffer).Data;
            uVar1 = pIVar11[lVar19].ClipRect.x;
            uVar5 = pIVar11[lVar19].ClipRect.y;
            local_88 = IVar3.x;
            fStack_84 = IVar3.y;
            local_98 = IVar4.x;
            fStack_94 = IVar4.y;
            fVar36 = ((float)uVar1 - local_88) * local_98;
            fVar37 = ((float)uVar5 - fStack_84) * fStack_94;
            if ((fVar36 < (float)iVar33) && (fVar37 < (float)iVar35)) {
              uVar2 = pIVar11[lVar19].ClipRect.z;
              uVar6 = pIVar11[lVar19].ClipRect.w;
              local_98 = ((float)uVar2 - local_88) * local_98;
              fStack_94 = ((float)uVar6 - fStack_84) * fStack_94;
              if ((0.0 <= local_98) && ((0.0 <= fStack_94 && (pIVar11[lVar19].ElemCount != 0)))) {
                local_c8._4_4_ = fStack_94 + -1.0;
                local_c8._0_4_ = local_98 + -1.0;
                local_c8._8_8_ = 0;
                uVar25 = 0;
                fVar26 = -10000.0;
                uVar41 = 0;
                uVar42 = 0;
                uVar43 = 0;
                fVar31 = fVar26;
                do {
                  uVar21 = pIVar11[lVar19].IdxOffset;
                  iVar14 = uVar21 + uVar25;
                  puVar12 = (pIVar10->IdxBuffer).Data;
                  pIVar13 = (pIVar10->VtxBuffer).Data;
                  uVar7 = puVar12[iVar14];
                  uVar8 = puVar12[(int)(uVar21 + 1 + uVar25)];
                  uVar9 = puVar12[(int)(uVar21 + 2 + uVar25)];
                  auVar46._8_8_ = 0;
                  auVar46._0_4_ = pIVar13[uVar7].pos.x;
                  auVar46._4_4_ = pIVar13[uVar7].pos.y;
                  auVar44._8_8_ = 0;
                  auVar44._0_4_ = pIVar13[uVar8].pos.x;
                  auVar44._4_4_ = pIVar13[uVar8].pos.y;
                  auVar45._8_8_ = 0;
                  auVar45._0_4_ = pIVar13[uVar9].pos.x;
                  auVar45._4_4_ = pIVar13[uVar9].pos.y;
                  auVar30 = minps(auVar46,local_c8._0_16_);
                  auVar38._4_4_ = fVar37;
                  auVar38._0_4_ = fVar36;
                  auVar38._8_8_ = 0;
                  auVar38 = maxps(auVar38,auVar30);
                  auVar30 = minps(auVar44,local_c8._0_16_);
                  auVar32._4_4_ = fVar37;
                  auVar32._0_4_ = fVar36;
                  auVar32._8_8_ = 0;
                  auVar30 = maxps(auVar32,auVar30);
                  auVar46 = minps(auVar45,local_c8._0_16_);
                  auVar34._4_4_ = fVar37;
                  auVar34._0_4_ = fVar36;
                  auVar34._8_8_ = 0;
                  auVar46 = maxps(auVar34,auVar46);
                  fVar28 = pIVar13[uVar7].uv.x;
                  fVar29 = pIVar13[uVar8].uv.x;
                  uVar21 = pIVar13[uVar7].col;
                  if ((((fVar28 != fVar29) || (fVar27 = pIVar13[uVar9].uv.x, fVar28 != fVar27)) ||
                      (fVar29 != fVar27)) || (NAN(fVar29) || NAN(fVar27))) {
LAB_001122fa:
                    auVar39._4_4_ = auVar38._4_4_ + auVar30._4_4_ + auVar46._4_4_;
                    auVar39._0_4_ = auVar39._4_4_;
                    auVar39._8_4_ = auVar39._4_4_;
                    auVar39._12_4_ = auVar39._4_4_;
                    auVar40._4_12_ = auVar39._4_12_;
                    fVar28 = (pIVar13[puVar12[iVar14 + 3]].pos.x +
                              auVar38._0_4_ + auVar30._0_4_ + auVar46._0_4_ +
                              pIVar13[puVar12[iVar14 + 4]].pos.x +
                             pIVar13[puVar12[iVar14 + 5]].pos.x) / 6.0;
                    auVar40._0_4_ =
                         (auVar39._4_4_ + pIVar13[puVar12[iVar14 + 3]].pos.y +
                          pIVar13[puVar12[iVar14 + 4]].pos.y + pIVar13[puVar12[iVar14 + 5]].pos.y) /
                         6.0 + 0.5;
                    if ((ABS(auVar40._0_4_ - fVar26) < 0.5) && (ABS(fVar28 - fVar31) < 0.5)) {
                      fVar28 = fVar31 + 1.0;
                      auVar40._4_4_ = uVar41;
                      auVar40._0_4_ = fVar26;
                      auVar40._8_4_ = uVar42;
                      auVar40._12_4_ = uVar43;
                    }
                    fVar31 = (float)(int)(fVar28 + 1.0);
                    fVar26 = auVar40._0_4_;
                    if ((fVar36 <= fVar31) && (fVar31 < local_98)) {
                      fVar31 = (float)(int)(fVar26 + 0.0);
                      if ((fVar37 <= fVar31) && (fVar31 < fStack_94)) {
                        pTVar16 = screen->data;
                        lVar24 = (long)((int)(fVar26 + 0.0) * screen->nx + (int)(fVar28 + 1.0));
                        uVar22 = uVar21 >> 0x18 |
                                 (uint)*(byte *)((long)pTVar16 + lVar24 * 4 + 3) << 0x18;
                        pTVar16[lVar24] = uVar22;
                        uVar17 = uVar21 & 0xff;
                        uVar20 = uVar21 >> 8 & 0xff;
                        uVar21 = uVar21 >> 0x10 & 0xff;
                        if (uVar20 == uVar21 && uVar17 == uVar20) {
                          uVar21 = 0x10;
                          if ((7 < uVar17) && (uVar21 = 0xe7, uVar17 < 0xf9)) {
                            fVar27 = roundf(((float)(int)(uVar17 - 8) / 247.0) * 24.0);
                            fVar27 = fVar27 + 232.0;
                            goto LAB_001126ed;
                          }
                        }
                        else {
                          fVar31 = roundf(((float)uVar17 / 255.0) * 5.0);
                          fVar29 = roundf(((float)uVar20 / 255.0) * 5.0);
                          fVar27 = roundf(((float)uVar21 / 255.0) * 5.0);
                          fVar27 = fVar27 + fVar29 * 6.0 + fVar31 * 36.0 + 16.0;
LAB_001126ed:
                          uVar21 = (uint)fVar27;
                        }
                        pTVar16[lVar24] = (uVar21 & 0xff) << 0x10 | uVar22;
                      }
                    }
                    uVar25 = uVar25 + 3;
                    uVar41 = auVar40._4_4_;
                    uVar42 = auVar40._8_4_;
                    uVar43 = auVar40._12_4_;
                  }
                  else {
                    fVar28 = pIVar13[uVar7].uv.y;
                    fVar29 = pIVar13[uVar8].uv.y;
                    if (((fVar28 != fVar29) || (fVar27 = pIVar13[uVar9].uv.y, fVar28 != fVar27)) ||
                       ((fVar29 != fVar27 || (NAN(fVar29) || NAN(fVar27))))) goto LAB_001122fa;
                    uVar17 = uVar21 & 0xff;
                    uVar22 = uVar21 >> 8 & 0xff;
                    uVar20 = uVar21 >> 0x10 & 0xff;
                    if (uVar22 == uVar20 && uVar17 == uVar22) {
                      col = '\x10';
                      if ((7 < uVar17) && (col = 0xe7, uVar17 < 0xf9)) {
                        fVar27 = roundf(((float)(int)(uVar17 - 8) / 247.0) * 24.0);
                        fVar27 = fVar27 + 232.0;
                        goto LAB_001125e9;
                      }
                    }
                    else {
                      fVar27 = (float)(uVar21 >> 0x18) / 255.0;
                      fVar28 = roundf((float)uVar17 * fVar27);
                      fVar29 = roundf((float)uVar22 * fVar27);
                      fVar27 = roundf((float)uVar20 * fVar27);
                      fVar28 = roundf(((float)((int)fVar28 & 0xff) / 255.0) * 5.0);
                      fVar29 = roundf(((float)((int)fVar29 & 0xff) / 255.0) * 5.0);
                      fVar27 = roundf(((float)((int)fVar27 & 0xff) / 255.0) * 5.0);
                      fVar27 = fVar27 + fVar29 * 6.0 + fVar28 * 36.0 + 16.0;
LAB_001125e9:
                      col = (uchar)(int)fVar27;
                    }
                    drawTriangle(auVar38._0_8_,auVar30._0_8_,auVar46._0_8_,col,screen);
                    uVar41 = 0;
                    uVar42 = 0;
                    uVar43 = 0;
                    fVar28 = fVar31;
                  }
                  uVar25 = uVar25 + 3;
                  fVar31 = fVar28;
                } while (uVar25 < pIVar11[lVar19].ElemCount);
              }
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (pIVar10->CmdBuffer).Size);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < drawData->CmdListsCount);
    }
  }
  return;
}

Assistant:

void ImTui_ImplText_RenderDrawData(ImDrawData * drawData, ImTui::TScreen * screen) {
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(drawData->DisplaySize.x * drawData->FramebufferScale.x);
    int fb_height = (int)(drawData->DisplaySize.y * drawData->FramebufferScale.y);

    if (fb_width <= 0 || fb_height <= 0) {
        return;
    }

    screen->resize(ImGui::GetIO().DisplaySize.x, ImGui::GetIO().DisplaySize.y);
    screen->clear();

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = drawData->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = drawData->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < drawData->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = drawData->CmdLists[n];

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            {
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    float lastCharX = -10000.0f;
                    float lastCharY = -10000.0f;

                    for (unsigned int i = 0; i < pcmd->ElemCount; i += 3) {
                        int vidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 0];
                        int vidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 1];
                        int vidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 2];

                        auto pos0 = cmd_list->VtxBuffer[vidx0].pos;
                        auto pos1 = cmd_list->VtxBuffer[vidx1].pos;
                        auto pos2 = cmd_list->VtxBuffer[vidx2].pos;

                        pos0.x = std::max(std::min(float(clip_rect.z - 1), pos0.x), clip_rect.x);
                        pos1.x = std::max(std::min(float(clip_rect.z - 1), pos1.x), clip_rect.x);
                        pos2.x = std::max(std::min(float(clip_rect.z - 1), pos2.x), clip_rect.x);
                        pos0.y = std::max(std::min(float(clip_rect.w - 1), pos0.y), clip_rect.y);
                        pos1.y = std::max(std::min(float(clip_rect.w - 1), pos1.y), clip_rect.y);
                        pos2.y = std::max(std::min(float(clip_rect.w - 1), pos2.y), clip_rect.y);

                        auto uv0 = cmd_list->VtxBuffer[vidx0].uv;
                        auto uv1 = cmd_list->VtxBuffer[vidx1].uv;
                        auto uv2 = cmd_list->VtxBuffer[vidx2].uv;

                        auto col0 = cmd_list->VtxBuffer[vidx0].col;
                        //auto col1 = cmd_list->VtxBuffer[vidx1].col;
                        //auto col2 = cmd_list->VtxBuffer[vidx2].col;

                        if (uv0.x != uv1.x || uv0.x != uv2.x || uv1.x != uv2.x ||
                            uv0.y != uv1.y || uv0.y != uv2.y || uv1.y != uv2.y) {
                            int vvidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 3];
                            int vvidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 4];
                            int vvidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 5];

                            auto ppos0 = cmd_list->VtxBuffer[vvidx0].pos;
                            auto ppos1 = cmd_list->VtxBuffer[vvidx1].pos;
                            auto ppos2 = cmd_list->VtxBuffer[vvidx2].pos;

                            float x = ((pos0.x + pos1.x + pos2.x + ppos0.x + ppos1.x + ppos2.x)/6.0f);
                            float y = ((pos0.y + pos1.y + pos2.y + ppos0.y + ppos1.y + ppos2.y)/6.0f) + 0.5f;

                            if (std::fabs(y - lastCharY) < 0.5f && std::fabs(x - lastCharX) < 0.5f) {
                                x = lastCharX + 1.0f;
                                y = lastCharY;
                            }

                            lastCharX = x;
                            lastCharY = y;

                            int xx = (x) + 1;
                            int yy = (y) + 0;
                            if (xx < clip_rect.x || xx >= clip_rect.z || yy < clip_rect.y || yy >= clip_rect.w) {
                            } else {
                                auto & cell = screen->data[yy*screen->nx + xx];
                                cell &= 0xFF000000;
                                cell |= (col0 & 0xff000000) >> 24;
                                cell |= ((ImTui::TCell)(rgbToAnsi256(col0, false)) << 16);
                            }
                            i += 3;
                        } else {
                            drawTriangle(pos0, pos1, pos2, rgbToAnsi256(col0, true), screen);
                        }
                    }
                }
            }
        }
    }

}